

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_145302::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  StringRef value_00;
  StringRef name_00;
  int iVar1;
  BuildFileDelegate *pBVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar5;
  bool bVar6;
  bool local_249;
  string local_210;
  char *local_1f0 [2];
  void *local_1e0;
  size_t local_1d8;
  ClangShellCommand *local_1d0;
  char *local_1c8;
  value_type local_1c0;
  char *local_1b0 [2];
  value_type local_1a0;
  undefined8 local_190 [2];
  value_type local_180;
  char *local_170 [2];
  char *local_160;
  size_t local_158;
  ConfigureContext *local_150;
  ConfigureContext *ctx_local;
  ClangShellCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  void *local_f8;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  char *local_d8;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  char **local_b8;
  char *local_b0;
  size_t local_a8;
  void **local_a0;
  char *local_98;
  size_t local_90;
  size_t local_88;
  char *local_80;
  void *local_78;
  int local_6c;
  size_t local_68;
  char *local_60;
  char *local_58;
  int local_4c;
  undefined1 *local_48;
  undefined8 *local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (ClangShellCommand *)value.Data;
  sVar5 = name.Length;
  local_160 = name.Data;
  local_30 = local_170;
  local_38 = "args";
  local_170[0] = "args";
  local_158 = sVar5;
  local_150 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_160;
  local_e0 = strlen("args");
  local_c8 = local_160;
  local_c0 = local_158;
  local_d8 = local_170[0];
  local_e8 = local_170[0];
  local_b0 = local_170[0];
  local_b8 = &local_c8;
  local_249 = false;
  local_d0 = local_e0;
  local_a8 = local_e0;
  if (local_158 == local_e0) {
    local_58 = local_160;
    local_60 = local_170[0];
    local_68 = local_e0;
    if (local_e0 == 0) {
      local_4c = 0;
    }
    else {
      local_4c = memcmp(local_160,local_170[0],local_e0);
    }
    local_249 = local_4c == 0;
  }
  if (local_249) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&this->args);
    pBVar2 = llbuild::buildsystem::ConfigureContext::getDelegate(local_150);
    local_40 = local_190;
    local_48 = llbuild::basic::DefaultShellPath_abi_cxx11_;
    local_190[0] = std::__cxx11::string::data();
    uVar3 = std::__cxx11::string::length();
    iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])(pBVar2,local_190[0],uVar3);
    local_180.Data = (char *)CONCAT44(extraout_var,iVar1);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_180);
    pBVar2 = llbuild::buildsystem::ConfigureContext::getDelegate(local_150);
    local_20 = local_1b0;
    local_28 = "-c";
    local_1b0[0] = "-c";
    sVar4 = strlen("-c");
    iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])(pBVar2,local_1b0[0],sVar4);
    local_1a0.Data = (char *)CONCAT44(extraout_var_00,iVar1);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_1a0);
    pBVar2 = llbuild::buildsystem::ConfigureContext::getDelegate(local_150);
    local_1d0 = this_local;
    local_1c8 = value_local.Data;
    iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])(pBVar2,this_local,value_local.Data);
    local_1c0.Data = (char *)CONCAT44(extraout_var_01,iVar1);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_1c0);
  }
  else {
    local_1e0 = (void *)value_local.Length;
    local_10 = local_1f0;
    local_18 = "deps";
    local_1f0[0] = "deps";
    local_1d8 = sVar5;
    local_90 = strlen("deps");
    local_f8 = local_1e0;
    local_f0 = local_1d8;
    local_98 = local_1f0[0];
    local_a0 = &local_f8;
    bVar6 = false;
    if (local_1d8 == local_90) {
      local_78 = local_1e0;
      local_80 = local_1f0[0];
      local_88 = local_90;
      if (local_90 == 0) {
        local_6c = 0;
      }
      else {
        local_6c = memcmp(local_1e0,local_1f0[0],local_90);
      }
      bVar6 = local_6c == 0;
    }
    if (!bVar6) {
      name_00.Length = sVar5;
      name_00.Data = (char *)value_local.Length;
      value_00.Length = (size_t)value_local.Data;
      value_00.Data = (char *)this_local;
      bVar6 = llbuild::buildsystem::ExternalCommand::configureAttribute
                        (&this->super_ExternalCommand,local_150,name_00,value_00);
      return bVar6;
    }
    llvm::StringRef::operator_cast_to_string(&local_210,(StringRef *)&this_local);
    std::__cxx11::string::operator=((string *)&this->depsPath,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "args") {
      // When provided as a scalar string, we default to executing using the
      // shell.
      args.clear();
      args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
      args.push_back(ctx.getDelegate().getInternedString("-c"));
      args.push_back(ctx.getDelegate().getInternedString(value));
    } else if (name == "deps") {
      depsPath = value;
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }